

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v10::basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::get
          (format_arg *__return_storage_ptr__,
          basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *this,int id)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *pvVar4;
  int id_local;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *this_local;
  
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (__return_storage_ptr__);
  bVar1 = is_packed(this);
  if (bVar1) {
    if (id < 0xf) {
      tVar3 = type(this,id);
      __return_storage_ptr__->type_ = tVar3;
      if (__return_storage_ptr__->type_ != none_type) {
        pvVar4 = (this->field_1).values_;
        (__return_storage_ptr__->value_).field_0.long_long_value =
             pvVar4[id].field_0.long_long_value;
        (__return_storage_ptr__->value_).field_0.string.size = pvVar4[id].field_0.string.size;
      }
    }
  }
  else {
    iVar2 = max_size(this);
    if (id < iVar2) {
      pvVar4 = (this->field_1).values_ + (long)id * 2;
      (__return_storage_ptr__->value_).field_0.long_long_value = (pvVar4->field_0).long_long_value;
      (__return_storage_ptr__->value_).field_0.string.size = (pvVar4->field_0).string.size;
      __return_storage_ptr__->type_ = pvVar4[1].field_0.int_value;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get(int id) const -> format_arg {
    format_arg arg;
    if (!is_packed()) {
      if (id < max_size()) arg = args_[id];
      return arg;
    }
    if (id >= detail::max_packed_args) return arg;
    arg.type_ = type(id);
    if (arg.type_ == detail::type::none_type) return arg;
    arg.value_ = values_[id];
    return arg;
  }